

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall QTextBrowser::doSetSource(QTextBrowser *this,QUrl *url,ResourceType type)

{
  QStack<QTextBrowserPrivate::HistoryEntry> *pQVar1;
  QTextBrowserPrivate *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  iterator iVar6;
  long in_FS_OFFSET;
  bool _t1;
  HistoryEntry historyEntry;
  QArrayDataPointer<char16_t> local_108;
  value_type local_f0;
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 local_78 [40];
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextBrowserPrivate **)
             &(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
  ;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBrowserPrivate::createHistoryEntry((HistoryEntry *)local_78,this_00);
  QTextBrowserPrivate::setSource(this_00,url,type);
  cVar5 = QUrl::isValid();
  if (cVar5 == '\0') goto LAB_004669b6;
  pQVar1 = &this_00->stack;
  if ((this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size != 0) {
    iVar6 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    cVar5 = ::comparesEqual(&iVar6.i[-1].url,url);
    if (cVar5 != '\0') goto LAB_004669b6;
    if ((this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size != 0) {
      iVar6 = QList<QTextBrowserPrivate::HistoryEntry>::end
                        (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
      QTextBrowserPrivate::HistoryEntry::operator=(iVar6.i + -1,(HistoryEntry *)local_78);
    }
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBrowserPrivate::HistoryEntry::HistoryEntry((HistoryEntry *)local_b8);
  QUrl::operator=((QUrl *)local_b8,url);
  local_88 = (undefined1 *)CONCAT44(local_88._4_4_,this_00->currentType);
  QTextEdit::documentTitle((QString *)&local_108,&this->super_QTextEdit);
  uVar4 = local_b8._24_8_;
  uVar3 = local_b8._16_8_;
  uVar2 = local_b8._8_8_;
  local_b8._8_8_ = local_108.d;
  local_b8._16_8_ = local_108.ptr;
  local_108.d = (Data *)uVar2;
  local_108.ptr = (char16_t *)uVar3;
  local_b8._24_8_ = local_108.size;
  local_108.size = uVar4;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  local_98._0_4_ = 0;
  local_98._4_4_ = 0;
  QList<QTextBrowserPrivate::HistoryEntry>::emplaceBack<QTextBrowserPrivate::HistoryEntry_const&>
            (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>,(HistoryEntry *)local_b8);
  backwardAvailable(this,1 < (ulong)(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.
                                    d.size);
  pQVar1 = &this_00->forwardStack;
  if ((this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size == 0) {
LAB_0046698f:
    QList<QTextBrowserPrivate::HistoryEntry>::clear
              (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    _t1 = false;
  }
  else {
    iVar6 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    cVar5 = ::comparesEqual(&iVar6.i[-1].url,url);
    if (cVar5 == '\0') goto LAB_0046698f;
    QList<QTextBrowserPrivate::HistoryEntry>::takeLast
              (&local_f0,&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry(&local_f0);
    _t1 = (this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size != 0;
  }
  forwardAvailable(this,_t1);
  historyChanged(this);
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry((HistoryEntry *)local_b8);
LAB_004669b6:
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry((HistoryEntry *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::doSetSource(const QUrl &url, QTextDocument::ResourceType type)
{
    Q_D(QTextBrowser);

    const QTextBrowserPrivate::HistoryEntry historyEntry = d->createHistoryEntry();

    d->setSource(url, type);

    if (!url.isValid())
        return;

    // the same url you are already watching?
    if (!d->stack.isEmpty() && d->stack.top().url == url)
        return;

    if (!d->stack.isEmpty())
        d->stack.top() = historyEntry;

    QTextBrowserPrivate::HistoryEntry entry;
    entry.url = url;
    entry.type = d->currentType;
    entry.title = documentTitle();
    entry.hpos = 0;
    entry.vpos = 0;
    d->stack.push(entry);

    emit backwardAvailable(d->stack.size() > 1);

    if (!d->forwardStack.isEmpty() && d->forwardStack.top().url == url) {
        d->forwardStack.pop();
        emit forwardAvailable(d->forwardStack.size() > 0);
    } else {
        d->forwardStack.clear();
        emit forwardAvailable(false);
    }

    emit historyChanged();
}